

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

int __thiscall DIS::Environment::getMarshalledSize(Environment *this)

{
  int marshalSize;
  Environment *this_local;
  
  return 8;
}

Assistant:

int Environment::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _environmentType
   marshalSize = marshalSize + 2;  // _length
   marshalSize = marshalSize + 1;  // _index
   marshalSize = marshalSize + 1;  // _padding
    return marshalSize;
}